

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O1

wchar_t cmd_get_arg_item(command_conflict *cmd,char *arg,object **obj)

{
  bool bVar1;
  int iVar2;
  wchar_t wVar3;
  cmd_arg_data_conflict in_RCX;
  long lVar4;
  char *__s1;
  
  __s1 = cmd->arg[0].name;
  lVar4 = 4;
  do {
    iVar2 = strcmp(__s1,arg);
    if (iVar2 == 0) {
      wVar3 = L'\0';
      if (((cmd_arg *)(__s1 + -0x10))->type == arg_ITEM) {
        in_RCX = *(cmd_arg_data_conflict *)(__s1 + -8);
        bVar1 = true;
      }
      else {
        wVar3 = L'\xfffffffe';
        bVar1 = false;
      }
      goto LAB_00130dda;
    }
    __s1 = __s1 + 0x28;
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  bVar1 = false;
  wVar3 = L'\xffffffff';
LAB_00130dda:
  if (bVar1) {
    *obj = (object *)in_RCX;
  }
  return wVar3;
}

Assistant:

int cmd_get_arg_item(struct command *cmd, const char *arg, struct object **obj)
{
	union cmd_arg_data data;
	int err;

	if ((err = cmd_get_arg(cmd, arg, arg_ITEM, &data)) == CMD_OK)
		*obj = data.obj;

	return err;
}